

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

int bounds_check(tgestate_t *state,vischar_t *vischar)

{
  vischar_t *in_RSI;
  tgestate_t *in_RDI;
  uint16_t maxheight;
  uint16_t minheight;
  uint16_t maxy;
  uint16_t miny;
  uint16_t maxx;
  uint16_t minx;
  wall_t *wall;
  uint8_t iters;
  wall_t *local_28;
  char local_19;
  int local_4;
  
  if (in_RDI->room_index == '\0') {
    local_19 = '\x18';
    local_28 = walls;
    do {
      if (((((ushort)((ushort)local_28->minx * 8 + 2) <= (in_RDI->saved_mappos).pos16.u) &&
           ((in_RDI->saved_mappos).pos16.u < (ushort)((ushort)local_28->maxx * 8 + 4))) &&
          ((ushort)((ushort)local_28->miny << 3) <= (in_RDI->saved_mappos).pos16.v)) &&
         ((((in_RDI->saved_mappos).pos16.v < (ushort)((ushort)local_28->maxy * 8 + 4) &&
           ((ushort)((ushort)local_28->minheight << 3) <= (in_RDI->saved_mappos).pos16.w)) &&
          ((in_RDI->saved_mappos).pos16.w < (ushort)((ushort)local_28->maxheight * 8 + 2))))) {
        in_RSI->counter_and_flags = in_RSI->counter_and_flags ^ 0x20;
        return 1;
      }
      local_28 = local_28 + 1;
      local_19 = local_19 + -1;
    } while (local_19 != '\0');
    local_4 = 0;
  }
  else {
    local_4 = interior_bounds_check(in_RDI,in_RSI);
  }
  return local_4;
}

Assistant:

int bounds_check(tgestate_t *state, vischar_t *vischar)
{
  uint8_t       iters; /* was B */
  const wall_t *wall;  /* was DE */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);

  if (state->room_index > room_0_OUTDOORS)
    return interior_bounds_check(state, vischar);

  iters = NELEMS(walls); /* All walls and fences. */
  wall  = &walls[0];
  do
  {
    uint16_t minx, maxx, miny, maxy, minheight, maxheight;

    minx      = wall->minx      * 8;
    maxx      = wall->maxx      * 8;
    miny      = wall->miny      * 8;
    maxy      = wall->maxy      * 8;
    minheight = wall->minheight * 8;
    maxheight = wall->maxheight * 8;

    if (state->saved_mappos.pos16.u >= minx + 2   &&
        state->saved_mappos.pos16.u <  maxx + 4   &&
        state->saved_mappos.pos16.v >= miny       &&
        state->saved_mappos.pos16.v <  maxy + 4   &&
        state->saved_mappos.pos16.w >= minheight  &&
        state->saved_mappos.pos16.w <  maxheight + 2)
    {
      vischar->counter_and_flags ^= vischar_BYTE7_V_DOMINANT;
      return 1; // NZ => outwith wall bounds
    }

    wall++;
  }
  while (--iters);

  return 0; // Z => within wall bounds
}